

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  cmNinjaDeps *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  int iVar3;
  int iVar4;
  cmGeneratorTarget *this_01;
  pointer pcVar5;
  cmOSXBundleGenerator *pcVar6;
  cmGeneratorTarget *pcVar7;
  cmLocalNinjaGenerator *this_02;
  cmMakefile *pcVar8;
  cmLocalNinjaGenerator *pcVar9;
  size_type sVar10;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  ulong uVar12;
  cmNinjaNormalTargetGenerator *this_03;
  bool bVar13;
  TargetType TVar14;
  int iVar15;
  string *psVar16;
  cmGlobalNinjaGenerator *pcVar17;
  cmGeneratedFileStream *pcVar18;
  char *pcVar19;
  size_t sVar20;
  ostream *poVar21;
  string *psVar22;
  mapped_type *pmVar23;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  long *plVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar25;
  MapToNinjaPathImpl __unary_op;
  mapped_type_conflict *pmVar26;
  cmGlobalNinjaGenerator *this_04;
  size_type *psVar27;
  size_type sVar28;
  cmCustomCommand *cc;
  pointer pbVar29;
  int *piVar30;
  long lVar31;
  pointer pbVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  string objPath;
  string postBuildCmdLine;
  bool usedResponseFile;
  string cmd;
  string rspfile;
  string obj_list_file;
  allocator_type local_6bd;
  TargetType local_6bc;
  cmNinjaNormalTargetGenerator *local_6b8;
  key_type local_6b0;
  cmMakefile *local_690;
  cmNinjaVars vars;
  string targetOutputReal;
  string cfgName;
  string targetOutput;
  cmNinjaVars symlinkVars;
  cmNinjaDeps objs;
  cmNinjaDeps symlinks;
  cmNinjaDeps byproducts;
  string linkPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  string frameworkPath;
  cmNinjaDeps emptyDeps;
  string createRule;
  string targetOutputImplib;
  cmNinjaDeps outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  cmNinjaDeps orderOnlyDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar16 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
  pcVar5 = (psVar16->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cfgName,pcVar5,pcVar5 + psVar16->_M_string_length);
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,this_01,&cfgName,false,false);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutput,pcVar17,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,this_01,&cfgName,false,true);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputReal,pcVar17,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,this_01,&cfgName,true,false);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputImplib,pcVar17,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar13 = cmGeneratorTarget::IsAppBundleOnApple(this_01);
  if (bVar13) {
    cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,false);
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&this->TargetNameOut,
               (string *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)&targetOutput);
    std::__cxx11::string::append((char *)&targetOutput);
    std::__cxx11::string::_M_append
              ((char *)&targetOutput,(ulong)(this->TargetNameOut)._M_dataplus._M_p);
    pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&comment,pcVar17,&targetOutput);
    std::__cxx11::string::operator=((string *)&targetOutput,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&targetOutputReal);
    std::__cxx11::string::append((char *)&targetOutputReal);
    std::__cxx11::string::_M_append
              ((char *)&targetOutputReal,(ulong)(this->TargetNameReal)._M_dataplus._M_p);
    pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&comment,pcVar17,&targetOutputReal);
    std::__cxx11::string::operator=((string *)&targetOutputReal,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
LAB_002b2d7b:
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  else {
    bVar13 = cmGeneratorTarget::IsFrameworkOnApple(this_01);
    if (bVar13) {
      pcVar6 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,false);
      cmOSXBundleGenerator::CreateFramework(pcVar6,&this->TargetNameOut,(string *)&symlinkVars);
      goto LAB_002b2d7b;
    }
    bVar13 = cmGeneratorTarget::IsCFBundleOnApple(this_01);
    if (bVar13) {
      pcVar6 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,false);
      cmOSXBundleGenerator::CreateCFBundle(pcVar6,&this->TargetNameOut,(string *)&symlinkVars);
      goto LAB_002b2d7b;
    }
  }
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar18);
  local_6bc = cmGeneratorTarget::GetType(this_01);
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar18,"# Link build statements for ",0x1c);
  pcVar19 = cmState::GetTargetTypeName(local_6bc);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)pcVar18 +
                    (int)(pcVar18->super_ofstream).
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar18,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar18," target ",8);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&symlinkVars,&this->super_cmNinjaTargetGenerator);
  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar18,(char *)symlinkVars._M_t._M_impl._0_8_,
                       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n\n",2);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Link the ",9);
  pcVar19 = GetVisibleTypeName(this);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)&objPath + (int)*(undefined8 *)(_comment + -0x18) + 0x5d0);
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&comment,targetOutputReal._M_dataplus._M_p,targetOutputReal._M_string_length
            );
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  __x = &(this->super_cmNinjaTargetGenerator).Objects;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,__x);
  cmNinjaTargetGenerator::ComputeLinkDeps_abi_cxx11_
            (&implicitDeps,&this->super_cmNinjaTargetGenerator);
  local_690 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  pcVar7 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar22 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  psVar16 = &this->TargetLinkLanguage;
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,pcVar7,psVar16,psVar22);
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&symlinkVars,createRule._M_dataplus._M_p,
             createRule._M_dataplus._M_p + createRule._M_string_length);
  std::__cxx11::string::append((char *)&symlinkVars);
  bVar13 = cmMakefile::IsOn(local_690,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  this_02 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  this_00 = &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&targetOutputReal,SHELL);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_FILE","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&objPath);
  postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postBuildCmdLine,"LINK_FLAGS","");
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&postBuildCmdLine);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)this_02,pmVar23,flags,linkFlags,&frameworkPath,&linkPath,pcVar7,
             bVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  pcVar8 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&symlinkVars,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS","");
  bVar13 = cmMakefile::IsOn(pcVar8,(string *)&symlinkVars);
  if (bVar13) {
    TVar14 = cmGeneratorTarget::GetType(this_01);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (TVar14 != SHARED_LIBRARY) goto LAB_002b352c;
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&symlinkVars,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    bVar13 = cmGeneratorTarget::GetPropertyAsBool(this_01,(string *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (!bVar13) goto LAB_002b352c;
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)&symlinkVars,this_01);
    psVar22 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
    std::operator+(&objPath,"/",psVar22);
    std::__cxx11::string::_M_append((char *)&symlinkVars,(ulong)objPath._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)&symlinkVars);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::append((char *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    pcVar9 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string
              ((string *)&postBuildCmdLine,(char *)symlinkVars._M_t._M_impl._0_8_,(allocator *)&cmd)
    ;
    cmOutputConverter::ConvertToOutputFormat
              (&objPath,&(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,&postBuildCmdLine,SHELL);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"LINK_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_append((char *)pmVar23,(ulong)objPath._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
LAB_002b352c:
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars,this_01,&vars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,pmVar23);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  cmGlobalNinjaGenerator::EncodeLiteral((string *)&symlinkVars,pmVar23);
  postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postBuildCmdLine,"LINK_FLAGS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&postBuildCmdLine);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  cmCommonTargetGenerator::GetManifests_abi_cxx11_
            ((string *)&symlinkVars,(cmCommonTargetGenerator *)this);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"MANIFESTS","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars,
                 &frameworkPath,&linkPath);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_PATH","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (local_6bc == EXECUTABLE) {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar5 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar5,pcVar5 + pmVar23->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_02,(string *)&symlinkVars,pcVar7,psVar16,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  else {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar5 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar5,pcVar5 + pmVar23->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_02,(string *)&symlinkVars,pcVar7,psVar16,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&symlinkVars,0,
               (char *)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,0x50ff0f);
    cmLocalGenerator::AddLanguageFlags
              ((cmLocalGenerator *)this_02,(string *)&symlinkVars,psVar16,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LANGUAGE_COMPILE_FLAGS","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar13 = cmGeneratorTarget::HasSOName
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,&cfgName);
  if (bVar13) {
    __s = cmMakefile::GetSONameFlag(local_690,psVar16);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME_FLAG","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    pcVar19 = (char *)pmVar23->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar23,0,pcVar19,(ulong)__s);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (local_6bc == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&symlinkVars,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &cfgName);
      if (symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        cmOutputConverter::Convert(&objPath,this_00,(string *)&symlinkVars,NONE,SHELL);
        postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&postBuildCmdLine,"INSTALLNAME_DIR","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&postBuildCmdLine);
        std::__cxx11::string::operator=((string *)pmVar23,(string *)&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
          operator_delete(postBuildCmdLine._M_dataplus._M_p,
                          CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                                   postBuildCmdLine.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,
                          CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                                   objPath.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
    }
  }
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->TargetNameImport)._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,this_00,&targetOutputImplib,SHELL);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_IMPLIB","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
    bVar13 = cmGeneratorTarget::HasImportLibrary(pcVar7);
    if (bVar13) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&targetOutputImplib);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  bVar13 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                     (&this->super_cmNinjaTargetGenerator,&vars);
  local_6b8 = this;
  if (!bVar13) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    objPath._M_string_length = 0;
    objPath.field_2._M_local_buf[0] = '\0';
    postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
    postBuildCmdLine._M_string_length = 0;
    postBuildCmdLine.field_2._M_local_buf[0] = '\0';
    pcVar7 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    paVar33 = &rspfile.field_2;
    rspfile._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"");
    cmGeneratorTarget::GetFullNameComponents
              (pcVar7,(string *)&symlinkVars,&objPath,&postBuildCmdLine,&rspfile,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar33) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,".dbg","");
    paVar1 = &cmd.field_2;
    cmd._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmd,"CMAKE_DEBUG_SYMBOL_SUFFIX","");
    pcVar19 = cmMakefile::GetDefinition(local_690,&cmd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmd._M_dataplus._M_p != paVar1) {
      operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
    }
    if (pcVar19 != (char *)0x0) {
      cmd._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cmd,"CMAKE_DEBUG_SYMBOL_SUFFIX","")
      ;
      pcVar19 = cmMakefile::GetDefinition(local_690,&cmd);
      sVar10 = rspfile._M_string_length;
      strlen(pcVar19);
      std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)sVar10,(ulong)pcVar19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmd._M_dataplus._M_p != paVar1) {
        operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+(&obj_list_file,&objPath,&postBuildCmdLine);
    plVar24 = (long *)std::__cxx11::string::_M_append
                                ((char *)&obj_list_file,(ulong)rspfile._M_dataplus._M_p);
    psVar27 = (size_type *)(plVar24 + 2);
    if ((size_type *)*plVar24 == psVar27) {
      cmd.field_2._M_allocated_capacity = *psVar27;
      cmd.field_2._8_8_ = plVar24[3];
      cmd._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      cmd.field_2._M_allocated_capacity = *psVar27;
      cmd._M_dataplus._M_p = (pointer)*plVar24;
    }
    cmd._M_string_length = plVar24[1];
    *plVar24 = (long)psVar27;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"TARGET_PDB","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_6b0);
    std::__cxx11::string::operator=((string *)pmVar23,(string *)&cmd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,
                      CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                               local_6b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmd._M_dataplus._M_p != paVar1) {
      operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
    }
    this = local_6b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar33) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar9 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&postBuildCmdLine,pcVar17,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&symlinkVars,
             &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &postBuildCmdLine,SHELL);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_DIR","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  if (pcVar17->UsingGCCOnWindows == true) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar10 = pmVar23->_M_string_length;
    if (sVar10 != 0) {
      pcVar5 = (pmVar23->_M_dataplus)._M_p;
      sVar28 = 0;
      do {
        if (pcVar5[sVar28] == '\\') {
          pcVar5[sVar28] = '/';
        }
        sVar28 = sVar28 + 1;
      } while (sVar10 != sVar28);
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_PATH","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar10 = pmVar23->_M_string_length;
    if (sVar10 != 0) {
      pcVar5 = (pmVar23->_M_dataplus)._M_p;
      sVar28 = 0;
      do {
        if (pcVar5[sVar28] == '\\') {
          pcVar5[sVar28] = '/';
        }
        sVar28 = sVar28 + 1;
      } while (sVar10 != sVar28);
    }
  }
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists[1] = cmGeneratorTarget::GetPreLinkCommands(this_01);
  cmdLists[2] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  lVar31 = 0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLineLists[0] = &preLinkCmdLines;
  cmdLineLists[1] = &preLinkCmdLines;
  cmdLineLists[2] = &postBuildCmdLines;
  do {
    pvVar11 = cmdLists[lVar31];
    cc = (pvVar11->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if (cc != (pvVar11->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&symlinkVars,cc,&cfgName,
                   (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
        cmLocalNinjaGenerator::AppendCustomCommandLines
                  (this_02,(cmCustomCommandGenerator *)&symlinkVars,cmdLineLists[lVar31]);
        pvVar25 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&symlinkVars);
        __first._M_current =
             (pvVar25->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pvVar25->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        __unary_op.GG =
             cmNinjaTargetGenerator::GetGlobalGenerator(&local_6b8->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (__first,__last,&byproducts,__unary_op);
        cmCustomCommandGenerator::~cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&symlinkVars);
        cc = cc + 1;
        this = local_6b8;
      } while (cc != (pvVar11->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar31 = lVar31 + 1;
  } while (lVar31 != 3);
  TVar14 = cmGeneratorTarget::GetType(this_01);
  if (TVar14 == SHARED_LIBRARY) {
    pcVar8 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&symlinkVars,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS","");
    bVar13 = cmMakefile::IsOn(pcVar8,(string *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (bVar13) {
      symlinkVars._M_t._M_impl._0_8_ =
           &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&symlinkVars,"WINDOWS_EXPORT_ALL_SYMBOLS","");
      bVar13 = cmGeneratorTarget::GetPropertyAsBool(this_01,(string *)&symlinkVars);
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (bVar13) {
        pcVar9 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        psVar16 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        cmOutputConverter::ConvertToOutputFormat
                  (&postBuildCmdLine,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,psVar16,SHELL);
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&rspfile,this_01);
        psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &symlinkVars,"/",psVar16);
        std::__cxx11::string::_M_append((char *)&rspfile,symlinkVars._M_t._M_impl._0_8_);
        if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
            &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                          (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        std::__cxx11::string::append((char *)&rspfile);
        cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&cmd,postBuildCmdLine._M_dataplus._M_p,
                   postBuildCmdLine._M_dataplus._M_p + postBuildCmdLine._M_string_length);
        std::__cxx11::string::append((char *)&cmd);
        pcVar9 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        std::__cxx11::string::string
                  ((string *)&obj_list_file,rspfile._M_dataplus._M_p,(allocator *)&local_6b0);
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)&symlinkVars,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&obj_list_file,SHELL);
        std::__cxx11::string::_M_append((char *)&cmd,symlinkVars._M_t._M_impl._0_8_);
        if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
            &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                          (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
          operator_delete(obj_list_file._M_dataplus._M_p,
                          obj_list_file.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&cmd);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&objs,__x);
        obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&obj_list_file,rspfile._M_dataplus._M_p,
                   rspfile._M_dataplus._M_p + rspfile._M_string_length);
        std::__cxx11::string::append((char *)&obj_list_file);
        pcVar9 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        std::__cxx11::string::string
                  ((string *)&local_6b0,obj_list_file._M_dataplus._M_p,(allocator *)&orderOnlyDeps);
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)&symlinkVars,
                   &(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_6b0,SHELL);
        std::__cxx11::string::_M_append((char *)&cmd,symlinkVars._M_t._M_impl._0_8_);
        if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
            &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                          (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
          operator_delete(local_6b0._M_dataplus._M_p,
                          CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                                   local_6b0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&preLinkCmdLines,&cmd);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&symlinkVars,obj_list_file._M_dataplus._M_p,false);
        pbVar32 = objs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar29 = objs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            uVar12 = pbVar29->_M_string_length;
            if (3 < uVar12) {
              pcVar19 = (pbVar29->_M_dataplus)._M_p;
              iVar15 = strcmp(pcVar19 + (uVar12 - 4),".obj");
              if (iVar15 == 0) {
                poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&symlinkVars,pcVar19,uVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"\n",1);
                pbVar32 = objs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            pbVar29 = pbVar29 + 1;
          } while (pbVar29 != pbVar32);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&symlinkVars);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
          operator_delete(obj_list_file._M_dataplus._M_p,
                          obj_list_file.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&objs);
        this = local_6b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmd._M_dataplus._M_p != &cmd.field_2) {
          operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
          operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
          operator_delete(postBuildCmdLine._M_dataplus._M_p,
                          CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                                   postBuildCmdLine.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  paVar33 = &rspfile.field_2;
  if (preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar19 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this_02);
    std::__cxx11::string::string((string *)&postBuildCmdLine,pcVar19,(allocator *)&rspfile);
    cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&postBuildCmdLine,SHELL)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    std::operator+(&postBuildCmdLine,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars
                  );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&postBuildCmdLine);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cmLocalNinjaGenerator::BuildCommandLine((string *)&symlinkVars,this_02,&preLinkCmdLines);
  postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postBuildCmdLine,"PRE_LINK","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&postBuildCmdLine);
  std::__cxx11::string::operator=((string *)pmVar23,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmLocalNinjaGenerator::BuildCommandLine(&postBuildCmdLine,this_02,&postBuildCmdLines);
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((targetOutput._M_string_length == targetOutputReal._M_string_length) &&
     ((targetOutput._M_string_length == 0 ||
      (iVar15 = bcmp(targetOutput._M_dataplus._M_p,targetOutputReal._M_dataplus._M_p,
                     targetOutput._M_string_length), iVar15 == 0)))) {
    rspfile._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  else {
    rspfile._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_replace((ulong)pmVar23,0,(char *)pmVar23->_M_string_length,0x4f0f30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar33) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)paVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar23 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&symlinkVars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar23);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar33) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  pcVar17 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  rspfile._M_dataplus._M_p = (pointer)paVar33;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&rspfile,"CMAKE_NINJA_FORCE_RESPONSE_FILE","");
  bVar13 = cmMakefile::IsDefinitionSet(local_690,&rspfile);
  if (bVar13) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar33) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    iVar15 = 1;
  }
  else {
    pcVar19 = cmsys::SystemTools::GetEnv("CMAKE_NINJA_FORCE_RESPONSE_FILE");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar33) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    iVar15 = 1;
    if (pcVar19 == (char *)0x0) {
      LanguageLinkerRule_abi_cxx11_(&rspfile,this);
      pmVar26 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&pcVar17->RuleCmdLength,&rspfile);
      iVar3 = *pmVar26;
      if (calculateCommandLineLengthLimit(int)::limits == '\0') {
        WriteLinkStatement();
      }
      lVar31 = 0;
      piVar30 = &calculateCommandLineLengthLimit(int)::limits;
      iVar15 = calculateCommandLineLengthLimit(int)::limits;
      do {
        iVar4 = *(int *)((long)&DAT_005d3ef0 + lVar31);
        if (iVar4 < iVar15) {
          piVar30 = (int *)((long)&DAT_005d3ef0 + lVar31);
          iVar15 = iVar4;
        }
        lVar31 = lVar31 + 4;
      } while (lVar31 != 8);
      iVar15 = -1;
      if (*piVar30 != 0x7fffffff) {
        iVar15 = *piVar30 - iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rspfile._M_dataplus._M_p != paVar33) {
        operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
      }
    }
  }
  obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&obj_list_file,"CMakeFiles/","");
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  plVar24 = (long *)std::__cxx11::string::_M_append
                              ((char *)&obj_list_file,(ulong)(psVar16->_M_dataplus)._M_p);
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  psVar27 = (size_type *)(plVar24 + 2);
  if ((size_type *)*plVar24 == psVar27) {
    cmd.field_2._M_allocated_capacity = *psVar27;
    cmd.field_2._8_8_ = plVar24[3];
  }
  else {
    cmd.field_2._M_allocated_capacity = *psVar27;
    cmd._M_dataplus._M_p = (pointer)*plVar24;
  }
  cmd._M_string_length = plVar24[1];
  *plVar24 = (long)psVar27;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  plVar24 = (long *)std::__cxx11::string::append((char *)&cmd);
  psVar27 = (size_type *)(plVar24 + 2);
  if ((size_type *)*plVar24 == psVar27) {
    rspfile.field_2._M_allocated_capacity = *psVar27;
    rspfile.field_2._8_8_ = plVar24[3];
    rspfile._M_dataplus._M_p = (pointer)paVar33;
  }
  else {
    rspfile.field_2._M_allocated_capacity = *psVar27;
    rspfile._M_dataplus._M_p = (pointer)*plVar24;
  }
  rspfile._M_string_length = plVar24[1];
  *plVar24 = (long)psVar27;
  plVar24[1] = 0;
  *(undefined1 *)(plVar24 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps);
  pcVar19 = "user=%s\x01auth=Bearer %s\x01\x01";
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar19 = "i <= LZMA_FILTERS_MAX + 1";
  }
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmd,"RESTAT","");
  pmVar23 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&cmd);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar23,0,(char *)pmVar23->_M_string_length,(ulong)(pcVar19 + 0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  pbVar32 = byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar29 = byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_04 = cmNinjaTargetGenerator::GetGlobalGenerator(&local_6b8->super_cmNinjaTargetGenerator)
      ;
      cmGlobalNinjaGenerator::SeenCustomCommandOutput(this_04,pbVar29);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&outputs,pbVar29);
      pbVar29 = pbVar29 + 1;
    } while (pbVar29 != pbVar32);
  }
  this_03 = local_6b8;
  usedResponseFile = false;
  pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&local_6b8->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerRule_abi_cxx11_(&obj_list_file,this_03);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar17,(ostream *)pcVar18,&cmd,&obj_list_file,&outputs,&explicitDeps,&implicitDeps,
             &orderOnlyDeps,&vars,&rspfile,iVar15,&usedResponseFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  WriteLinkRule(this_03,usedResponseFile);
  if (((targetOutput._M_string_length != targetOutputReal._M_string_length) ||
      ((targetOutput._M_string_length != 0 &&
       (iVar15 = bcmp(targetOutput._M_dataplus._M_p,targetOutputReal._M_dataplus._M_p,
                      targetOutput._M_string_length), iVar15 != 0)))) &&
     (bVar13 = cmGeneratorTarget::IsFrameworkOnApple(this_01), !bVar13)) {
    if (local_6bc == EXECUTABLE) {
      pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this_03->super_cmNinjaTargetGenerator);
      std::operator+(&cmd,"Create executable symlink ",&targetOutput);
      obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&obj_list_file,"CMAKE_SYMLINK_EXECUTABLE","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&objs,1,&targetOutput,(allocator_type *)&local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&symlinks,1,&targetOutputReal,&local_6bd);
      local_6b0._M_string_length = 0;
      local_6b0.field_2._M_local_buf[0] = '\0';
      local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar17,(ostream *)pcVar18,&cmd,&obj_list_file,&objs,&symlinks,&emptyDeps,
                 &emptyDeps,&symlinkVars,&local_6b0,-1,(bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
        operator_delete(local_6b0._M_dataplus._M_p,
                        CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                                 local_6b0.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmd._M_dataplus._M_p != &cmd.field_2) {
        operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmNinjaTargetGenerator::GetTargetFilePath
                (&cmd,&this_03->super_cmNinjaTargetGenerator,&this_03->TargetNameSO);
      sVar10 = cmd._M_string_length;
      if (((targetOutputReal._M_string_length == cmd._M_string_length) &&
          ((targetOutputReal._M_string_length == 0 ||
           (iVar15 = bcmp(targetOutputReal._M_dataplus._M_p,cmd._M_dataplus._M_p,
                          targetOutputReal._M_string_length), iVar15 == 0)))) ||
         ((targetOutput._M_string_length == sVar10 &&
          ((sVar10 == 0 ||
           (iVar15 = bcmp(targetOutput._M_dataplus._M_p,cmd._M_dataplus._M_p,sVar10), iVar15 == 0)))
          ))) {
        obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&obj_list_file,"SONAME","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,&obj_list_file);
        std::__cxx11::string::_M_assign((string *)pmVar23);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
          operator_delete(obj_list_file._M_dataplus._M_p,
                          obj_list_file.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&obj_list_file,"SONAME","");
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,&obj_list_file);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar23,0,(char *)pmVar23->_M_string_length,0x50ff0f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
          operator_delete(obj_list_file._M_dataplus._M_p,
                          obj_list_file.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&symlinks,&cmd);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&symlinks,&targetOutput);
      pcVar18 = cmNinjaTargetGenerator::GetBuildFileStream(&this_03->super_cmNinjaTargetGenerator);
      std::operator+(&obj_list_file,"Create library symlink ",&targetOutput);
      local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6b0,"CMAKE_SYMLINK_LIBRARY","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_270,1,&targetOutputReal,&local_6bd);
      ppbVar2 = &objs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar17,(ostream *)pcVar18,&obj_list_file,&local_6b0,&symlinks,&local_270,
                 &emptyDeps,&emptyDeps,&symlinkVars,(string *)&objs,-1,(bool *)0x0);
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(objs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 objs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
        operator_delete(local_6b0._M_dataplus._M_p,
                        CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                                 local_6b0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmd._M_dataplus._M_p != &cmd.field_2) {
        operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar17,&this_03->TargetNameOut,this_01);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&cmd,&this_03->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar17,&cmd,this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmd._M_dataplus._M_p != &cmd.field_2) {
    operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&symlinkVars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&postBuildCmdLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&preLinkCmdLines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
    operator_delete(targetOutputReal._M_dataplus._M_p,
                    targetOutputReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutput._M_dataplus._M_p != &targetOutput.field_2) {
    operator_delete(targetOutput._M_dataplus._M_p,targetOutput.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
    operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(
                               gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
                                   gt.GetFullPath(cfgName,
                                      /*implib=*/false,
                                      /*realpath=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
                                     gt.GetFullPath(cfgName,
                                       /*implib=*/true));

  if (gt.IsAppBundleOnApple())
    {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNameOut, outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNameOut;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNameReal;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
    }
  else if (gt.IsFrameworkOnApple())
    {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNameOut,
                                              gt.GetDirectory(cfgName));
    }
  else if(gt.IsCFBundleOnApple())
    {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNameOut,
                                             gt.GetDirectory(cfgName));
    }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmState::TargetType targetType = gt.GetType();
  this->GetBuildFileStream()
    << "# Link build statements for "
    << cmState::GetTargetTypeName(targetType)
    << " target "
    << this->GetTargetName()
    << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment <<
    "Link the " << this->GetVisibleTypeName() << " " << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps();

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;
  cmGeneratorTarget& genTarget = *this->GetGeneratorTarget();

  std::string createRule =
    genTarget.GetCreateRuleVariable(this->TargetLinkLanguage,
                                    this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule+"_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmLocalGenerator::SHELL);

  localGen.GetTargetFlags(vars["LINK_LIBRARIES"],
                          vars["FLAGS"],
                          vars["LINK_FLAGS"],
                          frameworkPath,
                          linkPath,
                          &genTarget,
                          useWatcomQuote);
  if(this->GetMakefile()->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS")
     && gt.GetType() == cmState::SHARED_LIBRARY)
    {
    if(gt.GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS"))
      {
      std::string name_of_def_file
        = gt.GetSupportDirectory();
      name_of_def_file += "/" + gt.GetName();
      name_of_def_file += ".def ";
      vars["LINK_FLAGS"] += " /DEF:";
      vars["LINK_FLAGS"] += this->GetLocalGenerator()
        ->ConvertToOutputFormat(name_of_def_file.c_str(),
                                cmLocalGenerator::SHELL);
      }
    }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] = cmGlobalNinjaGenerator
                        ::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmState::EXECUTABLE)
    {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    vars["FLAGS"] = t;
    }
  else
    {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t = "";
    localGen.AddLanguageFlags(t, TargetLinkLanguage, cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
    }

  if (this->GetGeneratorTarget()->HasSOName(cfgName))
    {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNameSO;
    if (targetType == cmState::SHARED_LIBRARY)
      {
      std::string install_dir =
          this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty())
        {
        vars["INSTALLNAME_DIR"] = localGen.Convert(install_dir,
                                                   cmLocalGenerator::NONE,
                                                   cmLocalGenerator::SHELL);
        }
      }
    }

  cmNinjaDeps byproducts;

  if (!this->TargetNameImport.empty())
    {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
                                              targetOutputImplib,
                                              cmLocalGenerator::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if(genTarget.HasImportLibrary())
      {
      byproducts.push_back(targetOutputImplib);
      }
    }

  if (!this->SetMsvcTargetPdbVariable(vars))
    {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX"))
      {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
      }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
    }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(objPath), cmLocalGenerator::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows())
    {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
    }

  const std::vector<cmCustomCommand> *cmdLists[3] = {
    &gt.GetPreBuildCommands(),
    &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string> *cmdLineLists[3] = {
    &preLinkCmdLines,
    &preLinkCmdLines,
    &postBuildCmdLines
  };

  for (unsigned i = 0; i != 3; ++i)
    {
    for (std::vector<cmCustomCommand>::const_iterator
         ci = cmdLists[i]->begin();
         ci != cmdLists[i]->end(); ++ci)
      {
      cmCustomCommandGenerator ccg(*ci, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
      }
    }

  // maybe create .def file from list of objects
  if (gt.GetType() == cmState::SHARED_LIBRARY &&
      this->GetMakefile()->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS"))
    {
    if(gt.GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS"))
      {
      std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
      std::string name_of_def_file
        = gt.GetSupportDirectory();
      name_of_def_file += "/" + gt.GetName();
      name_of_def_file += ".def";
      std::string cmd = cmakeCommand;
      cmd += " -E __create_def ";
      cmd += this->GetLocalGenerator()
        ->ConvertToOutputFormat(name_of_def_file.c_str(),
                                cmLocalGenerator::SHELL);
      cmd += " ";
      cmNinjaDeps objs = this->GetObjects();
      std::string obj_list_file = name_of_def_file;
      obj_list_file += ".objs";
      cmd += this->GetLocalGenerator()
        ->ConvertToOutputFormat(obj_list_file.c_str(),
                                cmLocalGenerator::SHELL);
      preLinkCmdLines.push_back(cmd);
      // create a list of obj files for the -E __create_def to read
      cmGeneratedFileStream fout(obj_list_file.c_str());
      for(cmNinjaDeps::iterator i=objs.begin(); i != objs.end(); ++i)
        {
        if(cmHasLiteralSuffix(*i, ".obj"))
          {
          fout << *i << "\n";
          }
        }
      }
    }
  // If we have any PRE_LINK commands, we need to go back to HOME_OUTPUT for
  // the link commands.
  if (!preLinkCmdLines.empty())
    {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
                                            localGen.GetBinaryDirectory(),
                                            cmLocalGenerator::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
    }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines);
  std::string postBuildCmdLine = localGen.BuildCommandLine(postBuildCmdLines);

  cmNinjaVars symlinkVars;
  if (targetOutput == targetOutputReal)
    {
    vars["POST_BUILD"] = postBuildCmdLine;
    }
  else
    {
    vars["POST_BUILD"] = ":";
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
    }

  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  int commandLineLengthLimit = 1;
  const char* forceRspFile = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  if (!mf->IsDefinitionSet(forceRspFile) &&
      cmSystemTools::GetEnv(forceRspFile) == 0)
    {
    commandLineLengthLimit = calculateCommandLineLengthLimit(
                globalGen.GetRuleCmdLength(this->LanguageLinkerRule()));
    }

  const std::string rspfile =
      std::string(cmake::GetCMakeFilesDirectoryPostSlash())
      + gt.GetName() + ".rsp";

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
    orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty()? "" : "1";

  for (cmNinjaDeps::const_iterator oi = byproducts.begin(),
         oe = byproducts.end();
       oi != oe; ++oi)
    {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(*oi);
    outputs.push_back(*oi);
    }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(),
                        comment.str(),
                        this->LanguageLinkerRule(),
                        outputs,
                        explicitDeps,
                        implicitDeps,
                        orderOnlyDeps,
                        vars,
                        rspfile,
                        commandLineLengthLimit,
                        &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple())
    {
    if (targetType == cmState::EXECUTABLE)
      {
      globalGen.WriteBuild(this->GetBuildFileStream(),
                            "Create executable symlink " + targetOutput,
                            "CMAKE_SYMLINK_EXECUTABLE",
                            cmNinjaDeps(1, targetOutput),
                            cmNinjaDeps(1, targetOutputReal),
                            emptyDeps,
                            emptyDeps,
                            symlinkVars);
      }
   else
     {
      cmNinjaDeps symlinks;
      const std::string soName = this->GetTargetFilePath(this->TargetNameSO);
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName)
        {
        symlinkVars["SONAME"] = soName;
        }
      else
        {
        symlinkVars["SONAME"] = "";
        symlinks.push_back(soName);
        }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(this->GetBuildFileStream(),
                                  "Create library symlink " + targetOutput,
                                     "CMAKE_SYMLINK_LIBRARY",
                                  symlinks,
                                  cmNinjaDeps(1, targetOutputReal),
                                  emptyDeps,
                                  emptyDeps,
                                  symlinkVars);
      }
    }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNameOut, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}